

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O2

int32 ngram_model_read_classdef(ngram_model_t *model,char *file_name)

{
  undefined8 *puVar1;
  int32 iVar2;
  int32 iVar3;
  hash_table_t *classes;
  glist_t g;
  gnode_s *pgVar4;
  gnode_s *pgVar5;
  
  classes = hash_table_new(0,0);
  iVar2 = read_classdef_file(classes,file_name);
  if (iVar2 < 0) {
    iVar2 = -1;
  }
  else {
    iVar2 = 0;
    g = hash_table_tolist(classes,(int32 *)0x0);
    for (pgVar5 = g; pgVar4 = g, pgVar5 != (glist_t)0x0; pgVar5 = pgVar5->next) {
      puVar1 = *(undefined8 **)((long)(pgVar5->data).ptr + 0x10);
      iVar3 = ngram_model_add_class
                        (model,*(pgVar5->data).ptr,1.0,(char **)*puVar1,(float32 *)puVar1[1],
                         *(int32 *)(puVar1 + 2));
      if (iVar3 < 0) {
        iVar2 = -1;
        break;
      }
    }
    for (; pgVar4 != (glist_t)0x0; pgVar4 = pgVar4->next) {
      puVar1 = (undefined8 *)(pgVar4->data).ptr;
      ckd_free((void *)*puVar1);
      classdef_free((classdef_t *)puVar1[2]);
    }
    glist_free(g);
  }
  hash_table_free(classes);
  return iVar2;
}

Assistant:

int32
ngram_model_read_classdef(ngram_model_t * model, const char *file_name)
{
    hash_table_t *classes;
    glist_t hl = NULL;
    gnode_t *gn;
    int32 rv = -1;

    classes = hash_table_new(0, FALSE);
    if (read_classdef_file(classes, file_name) < 0) {
        hash_table_free(classes);
        return -1;
    }

    /* Create a new class in the language model for each classdef. */
    hl = hash_table_tolist(classes, NULL);
    for (gn = hl; gn; gn = gnode_next(gn)) {
        hash_entry_t *he = gnode_ptr(gn);
        classdef_t *classdef = he->val;

        if (ngram_model_add_class(model, he->key, 1.0,
                                  classdef->words,
                                  classdef->weights,
                                  classdef->n_words) < 0)
            goto error_out;
    }
    rv = 0;

  error_out:
    for (gn = hl; gn; gn = gnode_next(gn)) {
        hash_entry_t *he = gnode_ptr(gn);
        ckd_free((char *) he->key);
        classdef_free(he->val);
    }
    glist_free(hl);
    hash_table_free(classes);
    return rv;
}